

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int IoTHubTransport_MQTT_Common_Subscribe_InputQueue(TRANSPORT_LL_HANDLE handle)

{
  char *format;
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char *pcVar3;
  STRING_HANDLE pSVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  int result;
  TRANSPORT_LL_HANDLE handle_local;
  
  format = TOPIC_INPUT_QUEUE_NAME;
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Subscribe_InputQueue",0xfda,1,
                "Invalid handle parameter. NULL.");
    }
    transport_data._4_4_ = 0xfdb;
  }
  else if (*(long *)((long)handle + 0x48) == 0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Subscribe_InputQueue",0xfdf,1,
                "ModuleID must be specified for input queues. NULL.");
    }
    transport_data._4_4_ = 0xfe0;
  }
  else {
    if (*(long *)((long)handle + 0x20) == 0) {
      pcVar2 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x40));
      pcVar3 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x48));
      pSVar4 = STRING_construct_sprintf(format,pcVar2,pcVar3);
      *(STRING_HANDLE *)((long)handle + 0x20) = pSVar4;
      if (pSVar4 == (STRING_HANDLE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"IoTHubTransport_MQTT_Common_Subscribe_InputQueue",0xfe5,1,
                    "Failure constructing Message Topic");
        }
        return 0xfe6;
      }
    }
    *(uint *)((long)handle + 0x30) = *(uint *)((long)handle + 0x30) | 0x10;
    changeStateToSubscribeIfAllowed((PMQTTTRANSPORT_HANDLE_DATA)handle);
    transport_data._4_4_ = 0;
  }
  return transport_data._4_4_;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe_InputQueue(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else if (transport_data->module_id == NULL)
    {
        LogError("ModuleID must be specified for input queues. NULL.");
        result = MU_FAILURE;
    }
    else if ((transport_data->topic_InputQueue == NULL) &&
        (transport_data->topic_InputQueue = STRING_construct_sprintf(TOPIC_INPUT_QUEUE_NAME, STRING_c_str(transport_data->device_id), STRING_c_str(transport_data->module_id))) == NULL)
    {
        LogError("Failure constructing Message Topic");
        result = MU_FAILURE;
    }
    else
    {
        transport_data->topics_ToSubscribe |= SUBSCRIBE_INPUT_QUEUE_TOPIC;
        changeStateToSubscribeIfAllowed(transport_data);
        result = 0;
    }
    return result;
}